

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

uint8_t __thiscall CPU::DEC(CPU *this,uint8_t argument)

{
  byte bVar1;
  uint8_t argument_local;
  CPU *this_local;
  
  bVar1 = argument - 1;
  if (bVar1 == 0) {
    this->field_0x2e = this->field_0x2e & 0xbf | 0x40;
  }
  else {
    this->field_0x2e = this->field_0x2e & 0xbf;
  }
  if ((bVar1 & 0x80) == 0) {
    this->field_0x2e = this->field_0x2e & 0xfe;
  }
  else {
    this->field_0x2e = this->field_0x2e & 0xfe | 1;
  }
  return bVar1;
}

Assistant:

uint8_t CPU::DEC(uint8_t argument) {
	argument--;
	if (argument == 0) {
		Z = 1;
	} else {
		Z = 0;
	}
	if (argument & (1 << 7)) {
		N = 1;
	} else {
		N = 0;
	}
	return argument;
}